

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

int __thiscall cmCPackArchiveGenerator::PackageComponentsAllInOne(cmCPackArchiveGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  Compress c;
  cmCPackLog *pcVar3;
  pointer pbVar4;
  long *plVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  string *psVar9;
  size_t sVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  Deduplicator deduplicator;
  cmArchiveWrite archive;
  cmGeneratedFileStream gf;
  long *local_510;
  long local_508;
  long local_500 [2];
  undefined1 local_4f0 [16];
  __node_base local_4e0;
  size_type sStack_4d8;
  float local_4d0;
  size_t local_4c8;
  __node_base _Stack_4c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_4b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_480 [4];
  undefined1 local_378 [64];
  _Alloc_hider local_338;
  size_type local_330;
  undefined1 local_298 [112];
  ios_base local_228 [504];
  
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_00,(this->super_cmCPackGenerator).packageFileNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             &(this->super_cmCPackGenerator).toplevel);
  std::__cxx11::string::append
            ((char *)(this->super_cmCPackGenerator).packageFileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  pcVar2 = local_298 + 0x10;
  local_298._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CPACK_ARCHIVE_FILE_NAME","");
  bVar7 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_298);
  if ((pointer)local_298._0_8_ != pcVar2) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  if (bVar7) {
    local_298._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"CPACK_ARCHIVE_FILE_NAME","");
    psVar9 = (string *)
             cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_298);
    if (psVar9 == (string *)0x0) {
      psVar9 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::_M_append
              ((char *)(this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,(ulong)(psVar9->_M_dataplus)._M_p)
    ;
  }
  else {
    local_298._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"CPACK_PACKAGE_FILE_NAME","");
    psVar9 = (string *)
             cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_298);
    if (psVar9 == (string *)0x0) {
      psVar9 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::_M_append
              ((char *)(this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,(ulong)(psVar9->_M_dataplus)._M_p)
    ;
  }
  if ((pointer)local_298._0_8_ != pcVar2) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  std::__cxx11::string::append
            ((char *)(this->super_cmCPackGenerator).packageFileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,
             "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
             ,0x59);
  std::ios::widen((char)(ostringstream *)local_298 + (char)*(undefined8 *)(local_298._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_298);
  std::ostream::flush();
  pcVar3 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  uVar6 = local_4f0._0_8_;
  sVar10 = strlen((char *)local_4f0._0_8_);
  cmCPackLog::Log(pcVar3,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0x1a3,(char *)uVar6,sVar10);
  if ((__node_base *)local_4f0._0_8_ != &local_4e0) {
    operator_delete((void *)local_4f0._0_8_,(ulong)((long)&(local_4e0._M_nxt)->_M_nxt + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
  std::ios_base::~ios_base(local_228);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)local_298,
             (this_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,false,true);
  iVar8 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])(this,local_298);
  if (iVar8 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4f0,"Problem to generate Header for archive <",0x28);
    pbVar4 = (this_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f0,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,">.",2);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar6 = local_378._0_8_;
    sVar10 = strlen((char *)local_378._0_8_);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x1a4,(char *)uVar6,sVar10);
    if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
      operator_delete((void *)local_378._0_8_,(ulong)((long)(uint *)local_378._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
    std::ios_base::~ios_base((ios_base *)local_480);
    iVar8 = 0;
    goto LAB_001e356a;
  }
  c = this->Compress;
  iVar8 = GetThreadCount(this);
  cmArchiveWrite::cmArchiveWrite
            ((cmArchiveWrite *)local_378,(ostream *)local_298,c,&this->ArchiveFormat,0,iVar8);
  bVar7 = cmArchiveWrite::Open((cmArchiveWrite *)local_378);
  if (bVar7) {
    if (local_330 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4f0,"Problem to create archive <",0x1b);
      pbVar4 = (this_00->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f0,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,">, ERROR = ",0xb);
      local_510 = local_500;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_510,local_338._M_p,local_338._M_p + local_330);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(char *)local_510,local_508);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      if (local_510 != local_500) {
        operator_delete(local_510,local_500[0] + 1);
      }
      pcVar3 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      plVar5 = local_510;
      sVar10 = strlen((char *)local_510);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x1a4,(char *)plVar5,sVar10);
      goto LAB_001e3526;
    }
    local_4f0._0_8_ = &_Stack_4c0;
    local_4f0._8_8_ = 1;
    local_4e0._M_nxt = (_Hash_node_base *)0x0;
    sStack_4d8 = 0;
    local_4d0 = 1.0;
    local_4c8 = 0;
    _Stack_4c0._M_nxt = (_Hash_node_base *)0x0;
    local_4b8._M_buckets = &local_4b8._M_single_bucket;
    local_4b8._M_bucket_count = 1;
    local_4b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_4b8._M_element_count = 0;
    local_4b8._M_rehash_policy._M_max_load_factor = 1.0;
    local_4b8._M_rehash_policy._M_next_resize = 0;
    local_4b8._M_single_bucket = (__node_base_ptr)0x0;
    local_480[0]._M_buckets = &local_480[0]._M_single_bucket;
    local_480[0]._M_bucket_count = 1;
    local_480[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_480[0]._M_element_count = 0;
    local_480[0]._M_rehash_policy._M_max_load_factor = 1.0;
    local_480[0]._M_rehash_policy._M_next_resize = 0;
    local_480[0]._M_single_bucket = (__node_base_ptr)0x0;
    p_Var12 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var1) {
      do {
        addOneComponentToArchive
                  (this,(cmArchiveWrite *)local_378,(cmCPackComponent *)(p_Var12 + 2),
                   (Deduplicator *)local_4f0);
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_480);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_4b8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_4f0);
    iVar8 = 1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4f0,"Problem to open archive <",0x19);
    pbVar4 = (this_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f0,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,">, ERROR = ",0xb);
    local_510 = local_500;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_510,local_338._M_p,local_338._M_p + local_330);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_510,local_508);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if (local_510 != local_500) {
      operator_delete(local_510,local_500[0] + 1);
    }
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    plVar5 = local_510;
    sVar10 = strlen((char *)local_510);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x1a4,(char *)plVar5,sVar10);
LAB_001e3526:
    if (local_510 != local_500) {
      operator_delete(local_510,local_500[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
    std::ios_base::~ios_base((ios_base *)local_480);
    iVar8 = 0;
  }
  cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_378);
LAB_001e356a:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  return iVar8;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponentsAllInOne()
{
  // reset the package file names
  this->packageFileNames.clear();
  this->packageFileNames.emplace_back(this->toplevel);
  this->packageFileNames[0] += "/";

  if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    this->packageFileNames[0] += *this->GetOption("CPACK_ARCHIVE_FILE_NAME");
  } else {
    this->packageFileNames[0] += *this->GetOption("CPACK_PACKAGE_FILE_NAME");
  }

  this->packageFileNames[0] += this->GetOutputExtension();

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                  << std::endl);
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0], archive);

  Deduplicator deduplicator;

  // The ALL COMPONENTS in ONE package case
  for (auto& comp : this->Components) {
    // Add the files of this component to the archive
    this->addOneComponentToArchive(archive, &(comp.second), &deduplicator);
  }

  // archive goes out of scope so it will finalized and closed.
  return 1;
}